

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

int Gia_ManBmcPerform(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  timespec ts;
  timespec local_40;
  
  iVar3 = pPars->nTimeOut;
  if ((long)iVar3 == 0) {
    lVar5 = 0;
  }
  else {
    iVar2 = clock_gettime(3,&local_40);
    if (iVar2 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    lVar5 = lVar5 + (long)iVar3 * 1000000;
  }
  if (pPars->nFramesAdd == 0) {
    iVar3 = Gia_ManBmcPerformInt(pGia,pPars);
    return iVar3;
  }
  if (pPars->nTimeOut < 0) {
    __assert_fail("pPars->nTimeOut >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                  ,0x430,"int Gia_ManBmcPerform(Gia_Man_t *, Bmc_AndPar_t *)");
  }
  while( true ) {
    if (lVar5 != 0) {
      iVar3 = clock_gettime(3,&local_40);
      if (iVar3 < 0) {
        lVar4 = -1;
      }
      else {
        lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      if (lVar5 < lVar4) {
        return -1;
      }
    }
    iVar3 = Gia_ManBmcPerformInt(pGia,pPars);
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = pPars->nTimeOut;
    if (iVar3 == 0) break;
    iVar2 = clock_gettime(3,&local_40);
    if (iVar2 < 0) {
      lVar4 = 1;
    }
    else {
      lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
      lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
    }
    iVar3 = iVar3 + -1;
    auVar1 = SEXT816(lVar4 + lVar5) * SEXT816(0x431bde82d7b634db);
    iVar2 = (int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f);
    if (iVar2 <= iVar3) {
      iVar3 = iVar2;
    }
    pPars->nTimeOut = iVar3;
    if (iVar3 < 1) {
      return -1;
    }
    pPars->nFramesAdd = pPars->nFramesAdd << 1;
  }
  return -1;
}

Assistant:

int Gia_ManBmcPerform( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    abctime TimeToStop = pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() : 0;
    if ( pPars->nFramesAdd == 0 )
        return Gia_ManBmcPerformInt( pGia, pPars );
    // iterate over the engine until we read the global timeout
    assert( pPars->nTimeOut >= 0 );
    while ( 1 )
    {
        if ( TimeToStop && TimeToStop < Abc_Clock() )
            return -1;
        if ( Gia_ManBmcPerformInt( pGia, pPars ) == 0 )
            return 0;
        // set the new runtime limit
        if ( pPars->nTimeOut )
        {
            pPars->nTimeOut = Abc_MinInt( pPars->nTimeOut-1, (int)((TimeToStop - Abc_Clock()) / CLOCKS_PER_SEC) );
            if ( pPars->nTimeOut <= 0 )
                return -1;
        }
        else
            return -1;
        // set the new frames limit
        pPars->nFramesAdd *= 2;
    }
    return -1;
}